

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_writer.c
# Opt level: O0

void dlep_writer_add_ipv6_conpoint_tlv(dlep_writer *writer,netaddr *addr,uint16_t port,_Bool tls)

{
  undefined1 local_38;
  undefined1 auStack_37 [7];
  uint8_t value [19];
  _Bool tls_local;
  uint16_t port_local;
  netaddr *addr_local;
  dlep_writer *writer_local;
  
  if (addr->_type == '\n') {
    value[0xd] = tls;
    value._14_2_ = port;
    unique0x10000082 = addr;
    value._14_2_ = htons(port);
    local_38 = (value[0xd] & 1) != 0;
    netaddr_to_binary(auStack_37,stack0xffffffffffffffe0,0x13);
    value[9] = value[0xe];
    value[10] = value[0xf];
    dlep_writer_add_tlv(writer,3,&local_38,0x13);
  }
  return;
}

Assistant:

void
dlep_writer_add_ipv6_conpoint_tlv(struct dlep_writer *writer, const struct netaddr *addr, uint16_t port, bool tls) {
  uint8_t value[19];

  if (netaddr_get_address_family(addr) != AF_INET6) {
    return;
  }

  /* convert port to network byte order */
  port = htons(port);

  /* copy data into value buffer */
  value[0] = tls ? DLEP_CONNECTION_TLS : DLEP_CONNECTION_PLAIN;
  netaddr_to_binary(&value[1], addr, sizeof(value));
  memcpy(&value[17], &port, sizeof(port));

  dlep_writer_add_tlv(writer, DLEP_IPV6_CONPOINT_TLV, &value, sizeof(value));
}